

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::CharSetLeaf::GetNextRange
          (CharSetLeaf *this,uint level,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  code *pcVar1;
  bool bVar2;
  int k;
  int iVar3;
  undefined4 *puVar4;
  uint uVar5;
  undefined6 in_register_00000012;
  uint uVar6;
  
  uVar5 = (uint)CONCAT62(in_register_00000012,searchCharStart);
  uVar6 = -1 << ((char)level * '\x04' + 8U & 0x1f);
  if (-uVar6 <= uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x341,"(searchCharStart < lim(level) + 1)",
                       "searchCharStart < lim(level) + 1");
    if (!bVar2) goto LAB_00e6f199;
    *puVar4 = 0;
  }
  k = CharBitvec::NextSet(&this->vec,uVar5);
  if (k != -1) {
    *outLowerChar = (Char)k;
    iVar3 = CharBitvec::NextClear(&this->vec,k);
    uVar5 = iVar3 - 1;
    if (iVar3 == -1) {
      uVar5 = ~uVar6;
    }
    if (0xffff < uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
      if (!bVar2) {
LAB_00e6f199:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    *outHigherChar = (Char)uVar5;
  }
  return k != -1;
}

Assistant:

bool CharSetLeaf::GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const
    {
        Assert(searchCharStart < lim(level) + 1);
        int nextSet = vec.NextSet(searchCharStart);

        if (nextSet == -1)
        {
            return false;
        }

        *outLowerChar = (char16)nextSet;

        int nextClear = vec.NextClear(nextSet);

        *outHigherChar = UTC(nextClear == -1 ? lim(level) : nextClear - 1);

        return true;
    }